

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTFusionRTQF.cpp
# Opt level: O3

void __thiscall RTFusionRTQF::predict(RTFusionRTQF *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  if ((this->super_RTFusion).m_enableGyro == true) {
    fVar7 = (this->m_gyro).m_data[0] * 0.5;
    uVar1 = *(undefined8 *)((this->m_gyro).m_data + 1);
    fVar8 = (float)uVar1 * 0.5;
    fVar9 = (float)((ulong)uVar1 >> 0x20) * 0.5;
    fVar3 = this->m_timeDelta;
    uVar1 = *(undefined8 *)(this->m_stateQ).m_data;
    uVar2 = *(undefined8 *)((this->m_stateQ).m_data + 2);
    fVar12 = (float)uVar2;
    fVar13 = (float)((ulong)uVar2 >> 0x20);
    fVar10 = (float)uVar1;
    fVar11 = (float)((ulong)uVar1 >> 0x20);
    fVar4 = (this->m_stateQ).m_data[1];
    fVar5 = (this->m_stateQ).m_data[2];
    fVar6 = (this->m_stateQ).m_data[3];
    (this->m_stateQ).m_data[0] =
         (this->m_stateQ).m_data[0] + fVar3 * (-fVar9 * fVar13 + -fVar7 * fVar11 + fVar12 * -fVar8);
    (this->m_stateQ).m_data[1] = fVar4 + fVar3 * (-fVar8 * fVar13 + fVar7 * fVar10 + fVar12 * fVar9)
    ;
    (this->m_stateQ).m_data[2] = fVar5 + fVar3 * (fVar7 * fVar13 + fVar8 * fVar10 + fVar11 * -fVar9)
    ;
    (this->m_stateQ).m_data[3] = fVar6 + fVar3 * (-fVar7 * fVar12 + fVar9 * fVar10 + fVar11 * fVar8)
    ;
    RTQuaternion::normalize(&this->m_stateQ);
    return;
  }
  return;
}

Assistant:

void RTFusionRTQF::predict()
{
    RTFLOAT x2, y2, z2;
    RTFLOAT qs, qx, qy,qz;

    if (!m_enableGyro)
        return;

    qs = m_stateQ.scalar();
    qx = m_stateQ.x();
    qy = m_stateQ.y();
    qz = m_stateQ.z();

    x2 = m_gyro.x() / (RTFLOAT)2.0;
    y2 = m_gyro.y() / (RTFLOAT)2.0;
    z2 = m_gyro.z() / (RTFLOAT)2.0;

    // Predict new state

    m_stateQ.setScalar(qs + (-x2 * qx - y2 * qy - z2 * qz) * m_timeDelta);
    m_stateQ.setX(qx + (x2 * qs + z2 * qy - y2 * qz) * m_timeDelta);
    m_stateQ.setY(qy + (y2 * qs - z2 * qx + x2 * qz) * m_timeDelta);
    m_stateQ.setZ(qz + (z2 * qs + y2 * qx - x2 * qy) * m_timeDelta);
    m_stateQ.normalize();
}